

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O2

ssize_t __thiscall
capnp::anon_unknown_0::AsyncMessageReader::read
          (AsyncMessageReader *this,int __fd,void *__buf,size_t __nbytes)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  OwnPromiseNode OVar2;
  void *pvVar3;
  undefined4 in_register_00000034;
  AsyncMessageReader *pAVar4;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:87:13)>
  *location_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_90;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  OwnPromiseNode local_78;
  undefined *local_70;
  undefined *puStack_68;
  undefined8 local_60;
  anon_class_32_3_1eb37b15_for_func local_58;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  pAVar4 = (AsyncMessageReader *)CONCAT44(in_register_00000034,__fd);
  (**(code **)(*__buf + 8))(&local_90,__buf,&(pAVar4->super_MessageReader).field_0xcc,8,8);
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:87:13)>
       ::anon_class_32_3_1eb37b15_for_func::operator();
  pPVar1 = ((local_90.ptr)->super_PromiseArenaMember).arena;
  local_58.this = pAVar4;
  local_58.inputStream = (AsyncInputStream *)__buf;
  local_58.scratchSpace.ptr = (word *)__nbytes;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_90.ptr - (long)pPVar1) < 0x40) {
    pvVar3 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:87:13)>
                   *)((long)pvVar3 + 0x3c0);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,capnp::(anonymous_namespace)::AsyncMessageReader::read(kj::AsyncInputStream&,kj::ArrayPtr<capnp::word>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::(anonymous_namespace)::AsyncMessageReader::read(kj::AsyncInputStream&,kj::ArrayPtr<capnp::word>)::__0,void*&>
              (location_00,&local_90,&local_58,&continuationTracePtr);
    *(void **)((long)pvVar3 + 0x3c8) = pvVar3;
  }
  else {
    ((local_90.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_00 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:87:13)>
                   *)(local_90.ptr + -4);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,capnp::(anonymous_namespace)::AsyncMessageReader::read(kj::AsyncInputStream&,kj::ArrayPtr<capnp::word>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::(anonymous_namespace)::AsyncMessageReader::read(kj::AsyncInputStream&,kj::ArrayPtr<capnp::word>)::__0,void*&>
              (location_00,&local_90,&local_58,&continuationTracePtr);
    local_90.ptr[-4].super_PromiseArenaMember.arena = pPVar1;
  }
  local_70 = &DAT_0042a172;
  puStack_68 = &DAT_0042a1d1;
  local_60 = 0x4c0000058b;
  location.function = &DAT_0042a1d1;
  location.fileName = &DAT_0042a172;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  intermediate.ptr = (PromiseNode *)location_00;
  kj::_::maybeChain<bool>(&local_78,(Promise<bool> *)&intermediate,location);
  OVar2.ptr = local_78.ptr;
  local_78.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_78);
  (this->super_MessageReader)._vptr_MessageReader = (_func_int **)OVar2.ptr;
  local_38.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_90);
  return (ssize_t)this;
}

Assistant:

kj::Promise<bool> AsyncMessageReader::read(kj::AsyncInputStream& inputStream,
                                           kj::ArrayPtr<word> scratchSpace) {
  return inputStream.tryRead(firstWord, sizeof(firstWord), sizeof(firstWord))
      .then([this,&inputStream,KJ_CPCAP(scratchSpace)](size_t n) mutable -> kj::Promise<bool> {
    if (n == 0) {
      return false;
    } else if (n < sizeof(firstWord)) {
      // EOF in first word.
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "Premature EOF."));
      return false;
    }

    return readAfterFirstWord(inputStream, scratchSpace).then([]() { return true; });
  });
}